

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string.c
# Opt level: O0

void test_archive_string_copy(void)

{
  archive_string *paVar1;
  undefined1 local_68 [8];
  archive_string v;
  archive_string u;
  archive_string t;
  archive_string s;
  
  t.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ù',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ù',0,"0",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ù',(char *)0x0,"((void*)0)",(char *)t.buffer_length,"(s).s",(void *)0x0,L'\0');
  u.buffer_length = 0;
  t.s = (char *)0x0;
  t.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'û',0,"0",0,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'û',0,"0",t.length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'û',(char *)0x0,"((void*)0)",(char *)u.buffer_length,"(t).s",(void *)0x0,L'\0');
  v.buffer_length = 0;
  u.s = (char *)0x0;
  u.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ý',0,"0",0,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ý',0,"0",u.length,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ý',(char *)0x0,"((void*)0)",(char *)v.buffer_length,"(u).s",(void *)0x0,L'\0');
  local_68 = (undefined1  [8])0x0;
  v.s = (char *)0x0;
  v.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ÿ',0,"0",0,"(v).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ÿ',0,"0",v.length,"(v).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ÿ',(char *)0x0,"((void*)0)",(char *)local_68,"(v).s",(void *)0x0,L'\0');
  t.s = (char *)0x0;
  archive_string_concat((archive_string *)&u.buffer_length,(archive_string *)&t.buffer_length);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ă',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ă',0,"0",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ă',(char *)0x0,"((void*)0)",(char *)t.buffer_length,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ą',0,"0",(longlong)t.s,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ą',0x20,"32",t.length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ą',"","\"\"",(char *)u.buffer_length,"(t).s",(void *)0x0,L'\0');
  u.s = (char *)0x0;
  archive_string_concat((archive_string *)&v.buffer_length,(archive_string *)&u.buffer_length);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĉ',0,"0",(longlong)t.s,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĉ',0x20,"32",t.length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ĉ',"","\"\"",(char *)u.buffer_length,"(t).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĉ',0,"0",(longlong)u.s,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĉ',0x20,"32",u.length,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ĉ',"","\"\"",(char *)v.buffer_length,"(u).s",(void *)0x0,L'\0');
  u.s = (char *)0x0;
  archive_string_concat((archive_string *)&v.buffer_length,(archive_string *)&u.buffer_length);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'č',0,"0",(longlong)t.s,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'č',0x20,"32",t.length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'č',"","\"\"",(char *)u.buffer_length,"(t).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ď',0,"0",(longlong)u.s,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ď',0x20,"32",u.length,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ď',"","\"\"",(char *)v.buffer_length,"(u).s",(void *)0x0,L'\0');
  paVar1 = archive_strncat((archive_string *)&t.buffer_length,"snafubar",8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'đ',(uint)(paVar1 != (archive_string *)0x0),
                   "NULL != archive_strcpy(&s, \"snafubar\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ē',8,"8",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ē',0x20,"32",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ē',"snafubar","\"snafubar\"",(char *)t.buffer_length,"(s).s",(void *)0x0,L'\0');
  v.s = (char *)0x0;
  archive_string_concat((archive_string *)local_68,(archive_string *)&t.buffer_length);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĕ',8,"8",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĕ',0x20,"32",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ĕ',"snafubar","\"snafubar\"",(char *)t.buffer_length,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ė',8,"8",(longlong)v.s,"(v).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ė',0x20,"32",v.length,"(v).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ė',"snafubar","\"snafubar\"",(char *)local_68,"(v).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ę',0,"0",(longlong)t.s,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ę',0x20,"32",t.length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ę',"","\"\"",(char *)u.buffer_length,"(t).s",(void *)0x0,L'\0');
  t.s = (char *)0x0;
  archive_string_concat((archive_string *)&u.buffer_length,(archive_string *)&t.buffer_length);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ě',8,"8",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ě',0x20,"32",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ě',"snafubar","\"snafubar\"",(char *)t.buffer_length,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĝ',8,"8",(longlong)t.s,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĝ',0x20,"32",t.length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ĝ',"snafubar","\"snafubar\"",(char *)u.buffer_length,"(t).s",(void *)0x0,L'\0');
  paVar1 = archive_strncat((archive_string *)&t.buffer_length,"fubar",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'ğ',(uint)(paVar1 != (archive_string *)0x0),
                   "NULL != archive_strcpy(&s, \"fubar\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ġ',5,"5",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ġ',0x20,"32",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ġ',"fubar","\"fubar\"",(char *)t.buffer_length,"(s).s",(void *)0x0,L'\0');
  t.s = (char *)0x0;
  archive_string_concat((archive_string *)&u.buffer_length,(archive_string *)&t.buffer_length);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ģ',5,"5",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ģ',0x20,"32",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ģ',"fubar","\"fubar\"",(char *)t.buffer_length,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĥ',5,"5",(longlong)t.s,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĥ',0x20,"32",t.length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ĥ',"fubar","\"fubar\"",(char *)u.buffer_length,"(t).s",(void *)0x0,L'\0');
  archive_string_free((archive_string *)local_68);
  archive_string_free((archive_string *)&v.buffer_length);
  archive_string_free((archive_string *)&u.buffer_length);
  archive_string_free((archive_string *)&t.buffer_length);
  return;
}

Assistant:

static void
test_archive_string_copy(void)
{
	struct archive_string s, t, u, v;

	archive_string_init(&s);
	assertExactString(0, 0, NULL, s);
	archive_string_init(&t);
	assertExactString(0, 0, NULL, t);
	archive_string_init(&u);
	assertExactString(0, 0, NULL, u);
	archive_string_init(&v);
	assertExactString(0, 0, NULL, v);

	/* null target, null source */
	archive_string_copy(&t, &s);
	assertExactString(0, 0, NULL, s);
	assertExactString(0, EXTENT, "", t);

	/* null target, empty source */
	archive_string_copy(&u, &t);
	assertExactString(0, EXTENT, "", t);
	assertExactString(0, EXTENT, "", u);

	/* empty target, empty source */
	archive_string_copy(&u, &t);
	assertExactString(0, EXTENT, "", t);
	assertExactString(0, EXTENT, "", u);

	/* null target, non-empty source */
	assert(NULL != archive_strcpy(&s, "snafubar"));
	assertExactString(8, EXTENT, "snafubar", s);

	archive_string_copy(&v, &s);
	assertExactString(8, EXTENT, "snafubar", s);
	assertExactString(8, EXTENT, "snafubar", v);

	/* empty target, non-empty source */
	assertExactString(0, EXTENT, "", t);
	archive_string_copy(&t, &s);
	assertExactString(8, EXTENT, "snafubar", s);
	assertExactString(8, EXTENT, "snafubar", t);

	/* non-empty target, non-empty source */
	assert(NULL != archive_strcpy(&s, "fubar"));
	assertExactString(5, EXTENT, "fubar", s);

	archive_string_copy(&t, &s);
	assertExactString(5, EXTENT, "fubar", s);
	assertExactString(5, EXTENT, "fubar", t);

	archive_string_free(&v);
	archive_string_free(&u);
	archive_string_free(&t);
	archive_string_free(&s);
}